

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void magma_get_key(gost_ctx *c,byte *k)

{
  int j;
  int i;
  byte *k_local;
  gost_ctx *c_local;
  
  j = 0;
  for (i = 0; i < 8; i = i + 1) {
    k[j + 3] = (char)c->key[i] + (char)c->mask[i];
    k[j + 2] = (byte)(c->key[i] + c->mask[i] >> 8);
    k[j + 1] = (byte)(c->key[i] + c->mask[i] >> 0x10);
    k[j] = (byte)(c->key[i] + c->mask[i] >> 0x18);
    j = j + 4;
  }
  return;
}

Assistant:

void magma_get_key(gost_ctx * c, byte * k)
{
    int i, j;
    for (i = 0, j = 0; i < 8; i++, j += 4) {
        k[j + 3] = (byte) ((c->key[i] + c->mask[i]) & 0xFF);
        k[j + 2] = (byte) (((c->key[i] + c->mask[i]) >> 8) & 0xFF);
        k[j + 1] = (byte) (((c->key[i] + c->mask[i]) >> 16) & 0xFF);
        k[j + 0] = (byte) (((c->key[i] + c->mask[i]) >> 24) & 0xFF);
    }
}